

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidBranchOutputNotProduced2(void)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  TypeUnion TVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  ActivationReLU *pAVar11;
  NeuralNetworkLayer *pNVar12;
  LayerUnion LVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  void *pvVar15;
  NeuralNetwork *this_01;
  ostream *poVar16;
  long lVar17;
  undefined8 *puVar18;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar19;
  Arena *pAVar20;
  Model m;
  Result res;
  NeuralNetwork nnIf;
  Model MStack_d8;
  Result local_a8;
  NeuralNetwork local_80;
  
  CoreML::Specification::Model::Model(&MStack_d8,(Arena *)0x0,false);
  if (MStack_d8.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_d8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar3 = ((MStack_d8.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00185930:
    pRVar19 = &(MStack_d8.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((MStack_d8.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00185930;
    ((MStack_d8.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"A",puVar18);
  pFVar7 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
    pFVar7 = *(FeatureType **)((long)pvVar15 + 0x20);
    if (pFVar7 == (FeatureType *)0x0) {
      pAVar20 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
        pAVar20 = *(Arena **)pAVar20;
      }
      pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                         (pAVar20);
      *(FeatureType **)((long)pvVar15 + 0x20) = pFVar7;
    }
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  this = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  if (uVar2 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
    plVar9 = google::protobuf::RepeatedField<long>::elements(this);
    plVar9[uVar2] = 1;
  }
  else {
    plVar9 = google::protobuf::RepeatedField<long>::elements(this);
    plVar9[uVar2] = 1;
  }
  this->current_size_ = uVar2 + 1;
  if (MStack_d8.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_d8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar3 = ((MStack_d8.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00185ab6:
    pRVar19 = &(MStack_d8.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((MStack_d8.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00185ab6;
    ((MStack_d8.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"B",puVar18);
  pFVar7 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&local_80,(Arena *)0x0,false);
  if ((local_80.layers_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) ||
     (lVar17 = (long)local_80.layers_.super_RepeatedPtrFieldBase.current_size_,
     (local_80.layers_.super_RepeatedPtrFieldBase.rep_)->allocated_size <=
     local_80.layers_.super_RepeatedPtrFieldBase.current_size_)) {
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_80.layers_.super_RepeatedPtrFieldBase.arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&local_80.layers_.super_RepeatedPtrFieldBase,pNVar12);
  }
  else {
    local_80.layers_.super_RepeatedPtrFieldBase.current_size_ =
         local_80.layers_.super_RepeatedPtrFieldBase.current_size_ + 1;
    pNVar12 = (NeuralNetworkLayer *)
              (local_80.layers_.super_RepeatedPtrFieldBase.rep_)->elements[lVar17];
  }
  if (pNVar12->_oneof_case_[0] == 0x82) {
    LVar13 = pNVar12->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x82;
    uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    LVar13.activation_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                   (pAVar20);
    (pNVar12->layer_).activation_ = (ActivationParams *)LVar13;
  }
  if (*(int *)((long)&((LVar13.convolution_)->kernelsize_).arena_or_elements_ + 4) != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(LVar13.activation_);
    *(undefined4 *)((long)&((LVar13.convolution_)->kernelsize_).arena_or_elements_ + 4) = 10;
    uVar4 = ((LVar13.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar20);
    ((LVar13.activation_)->NonlinearityType_).relu_ = pAVar11;
  }
  uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
  puVar18 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar12->name_,"if_relu",puVar18);
  pRVar3 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00185c54:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00185c54;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3975b4);
  pRVar3 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00185ca4:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00185ca4;
    (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3b5c76);
  if (MStack_d8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_d8);
    MStack_d8._oneof_case_[0] = 500;
    pAVar20 = (Arena *)(MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    MStack_d8.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar20);
  }
  TVar5 = MStack_d8.Type_;
  (MStack_d8.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_d8.Type_.pipeline_)->models_;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_d8.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00185d41:
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar12);
  }
  else {
    iVar1 = (MStack_d8.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00185d41;
    (MStack_d8.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  if (pNVar12->_oneof_case_[0] == 0x82) {
    LVar13 = pNVar12->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x82;
    uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    LVar13.activation_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                   (pAVar20);
    (pNVar12->layer_).activation_ = (ActivationParams *)LVar13;
  }
  if (*(uint32_t *)((long)&(LVar13.convolution_)->kernelsize_ + 0xc) != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(LVar13.activation_);
    *(uint32_t *)((long)&(LVar13.convolution_)->kernelsize_ + 0xc) = 10;
    uVar4 = ((LVar13.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar20);
    ((LVar13.activation_)->NonlinearityType_).relu_ = pAVar11;
  }
  uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
  puVar18 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pNVar12->name_,"condition_producing_layer",puVar18);
  pRVar3 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00185e1b:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00185e1b;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3975b4);
  pRVar3 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00185e6d:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar1 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00185e6d;
    (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar15 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x397c4b);
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(TVar5.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00185ebd:
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar12);
  }
  else {
    iVar1 = (TVar5.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00185ebd;
    (TVar5.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  if (pNVar12->_oneof_case_[0] == 0x25d) {
    LVar13 = pNVar12->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x25d;
    uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    LVar13.branch_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BranchLayerParams>
                   (pAVar20);
    (pNVar12->layer_).branch_ = (BranchLayerParams *)LVar13;
  }
  uVar4 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
  puVar18 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pNVar12->name_,"branch_layer",puVar18);
  pRVar3 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar15 = pRVar3->elements[iVar1];
      goto LAB_00185f7a;
    }
  }
  pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
  pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar14);
LAB_00185f7a:
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x397c4b);
  this_01 = (NeuralNetwork *)((LVar13.activation_)->NonlinearityType_).linear_;
  if (this_01 == (NeuralNetwork *)0x0) {
    uVar4 = ((LVar13.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                        (pAVar20);
    ((LVar13.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)this_01;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom(this_01,&local_80);
  CoreML::validate<(MLModelType)500>(&local_a8,&MStack_d8);
  bVar6 = CoreML::Result::good(&local_a8);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x113f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_message._M_dataplus._M_p != &local_a8.m_message.field_2) {
    operator_delete(local_a8.m_message._M_dataplus._M_p,
                    local_a8.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&local_80);
  CoreML::Specification::Model::~Model(&MStack_d8);
  return (uint)bVar6;
}

Assistant:

int testInvalidBranchOutputNotProduced2() {
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    // "If" net
    Specification::NeuralNetwork nnIf;
    auto *l1 = nnIf.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("if_relu");
    l1->add_input("A");
    l1->add_output("B");

    // Main network
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    (void)l3->mutable_activation()->mutable_relu();
    l3->set_name("condition_producing_layer");
    l3->add_input("A");
    l3->add_output("cond");

    auto *l4 = nnMain->add_layers();
    auto *branch_layer = l4->mutable_branch();
    l4->set_name("branch_layer");
    l4->add_input("cond");
    branch_layer->mutable_ifbranch()->CopyFrom(nnIf);

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}